

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lodtalk.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  VMContext *pVVar1;
  string *psVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  string scriptFilename;
  undefined1 *local_98;
  char *local_90;
  undefined1 local_88 [16];
  code **local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  context = (VMContext *)Lodtalk::createVMContext();
  local_98 = local_88;
  local_90 = (char *)0x0;
  local_88[0] = 0;
  if (1 < argc) {
    uVar5 = 1;
    do {
      __s1 = argv[uVar5];
      iVar4 = strcmp(__s1,"-help");
      pcVar3 = local_90;
      if ((iVar4 == 0) || (((*__s1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0')))) {
        puts("LodtalkRunner");
        iVar4 = 0;
        goto LAB_0010249f;
      }
      strlen(__s1);
      std::__cxx11::string::_M_replace((ulong)&local_98,0,pcVar3,(ulong)__s1);
      uVar5 = uVar5 + 1;
    } while ((uint)argc != uVar5);
    if (local_90 != (char *)0x0) {
      loadKernel();
      iVar4 = std::__cxx11::string::compare((char *)&local_98);
      psVar2 = _stdin;
      pVVar1 = context;
      if (iVar4 == 0) {
        local_78 = &local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"stdin","");
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
        Lodtalk::VMContext::executeScriptFromFile((_IO_FILE *)pVVar1,psVar2,(string *)&local_78);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78);
        }
      }
      else {
        Lodtalk::VMContext::executeScriptFromFileNamed((string *)context);
      }
      local_78 = (code **)0x0;
      uStack_70 = 0;
      local_60 = std::
                 _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/apps/Lodtalk.cpp:62:30)>
                 ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(Lodtalk::InterpreterProxy_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/apps/Lodtalk.cpp:62:30)>
                 ::_M_manager;
      Lodtalk::VMContext::withInterpreter((function *)context);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      iVar4 = 0;
      goto LAB_0010249f;
    }
  }
  puts("LodtalkRunner");
  iVar4 = -1;
LAB_0010249f:
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  return iVar4;
}

Assistant:

int main(int argc, const char *argv[])
{
    context = createVMContext();

    std::string scriptFilename;

    for(int i = 1; i < argc; ++i)
    {
        if(!strcmp(argv[i], "-help") ||
           !strcmp(argv[i], "-h"))
        {
            printHelp();
            return 0;
        }
        else
        {
            scriptFilename = argv[i];
        }
    }

    if(scriptFilename.empty())
    {
        printHelp();
        return -1;
    }

    // Execute the kernel script
    loadKernel();

    // Execute the source script.
    if(scriptFilename == "-")
    {
        // Execute script from the standard input.
        context->executeScriptFromFile(stdin, "stdin");
    }
    else
    {
        // Execute the script from the file.
        context->executeScriptFromFileNamed(scriptFilename);
    }

    // Call the main function.
    context->withInterpreter([&](InterpreterProxy *interpreter) {
        interpreter->pushOop(context->getGlobalContext());
        interpreter->sendMessageWithSelector(context->makeSelector("main"), 0);
        interpreter->popOop();
    });
    return 0;
}